

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::prepare(WasmBinaryWriter *this)

{
  IndexedHeapTypes *this_00;
  pointer pHVar1;
  pointer pHVar2;
  undefined1 auVar3 [16];
  Type __p;
  WasmBinaryWriter *pWVar4;
  bool bVar5;
  long lVar6;
  __hashtable *__h;
  ulong uVar7;
  Signature local_88;
  undefined4 local_78;
  WasmBinaryWriter *local_38;
  
  wasm::ModuleUtils::getOptimizedIndexedHeapTypes((IndexedHeapTypes *)&local_88,this->wasm);
  this_00 = &this->indexedTypes;
  wasm::ModuleUtils::IndexedHeapTypes::operator=(this_00,(IndexedHeapTypes *)&local_88);
  wasm::ModuleUtils::IndexedHeapTypes::~IndexedHeapTypes((IndexedHeapTypes *)&local_88);
  pHVar1 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar2 = (this->indexedTypes).types.
           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = 0;
  local_38 = this;
  for (uVar7 = 0; pWVar4 = local_38,
      ((ulong)((long)pHVar1 - (long)pHVar2) >> 3 & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
    bVar5 = HeapType::isSignature
                      ((HeapType *)
                       ((long)&((this_00->types).
                                super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                                _M_impl.super__Vector_impl_data._M_start)->id + lVar6));
    if (bVar5) {
      local_88 = HeapType::getSignature
                           ((HeapType *)
                            ((long)&((this_00->types).
                                     super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->id + lVar6));
      local_78 = (undefined4)uVar7;
      std::
      _Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<wasm::Signature_const,unsigned_int>>
                ((_Hashtable<wasm::Signature,std::pair<wasm::Signature_const,unsigned_int>,std::allocator<std::pair<wasm::Signature_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::Signature>,std::hash<wasm::Signature>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->signatureIndexes,&local_88);
    }
    lVar6 = lVar6 + 8;
  }
  std::make_unique<wasm::ImportInfo,wasm::Module&>((Module *)&local_88);
  __p.id = local_88.params.id;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_88.results.id;
  local_88 = (Signature)(auVar3 << 0x40);
  std::__uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::reset
            ((__uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_> *)
             &pWVar4->importInfo,(pointer)__p.id);
  std::unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::~unique_ptr
            ((unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_> *)&local_88);
  return;
}

Assistant:

void WasmBinaryWriter::prepare() {
  // Collect function types and their frequencies. Collect information in each
  // function in parallel, then merge.
  indexedTypes = ModuleUtils::getOptimizedIndexedHeapTypes(*wasm);
  for (Index i = 0, size = indexedTypes.types.size(); i < size; ++i) {
    if (indexedTypes.types[i].isSignature()) {
      signatureIndexes.insert({indexedTypes.types[i].getSignature(), i});
    }
  }
  importInfo = std::make_unique<ImportInfo>(*wasm);
}